

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1884927::DropoutTest_KeepsLargeCoeffs_Test::TestBody
          (DropoutTest_KeepsLargeCoeffs_Test *this)

{
  int in_ECX;
  long lVar1;
  int *piVar2;
  int *piVar3;
  tran_low_t *in_R8;
  byte bVar4;
  initializer_list<int> __l;
  allocator_type local_131;
  _Vector_base<int,_std::allocator<int>_> local_130;
  tran_low_t qcoeff_scan [32];
  int local_90 [32];
  
  bVar4 = 0;
  qcoeff_scan[4] = 0;
  qcoeff_scan[5] = 0;
  qcoeff_scan[0x14] = 0;
  qcoeff_scan[0x15] = 0;
  qcoeff_scan[0x1c] = 0;
  qcoeff_scan[0x1d] = 0;
  qcoeff_scan[0x1e] = 0;
  qcoeff_scan[0x1f] = 0;
  qcoeff_scan[0x18] = 0;
  qcoeff_scan[0x19] = 0;
  qcoeff_scan[0x1a] = 0;
  qcoeff_scan[0x1b] = 0;
  qcoeff_scan[0x10] = 0;
  qcoeff_scan[0x11] = 0;
  qcoeff_scan[0x12] = 0;
  qcoeff_scan[0x13] = 0;
  qcoeff_scan[0xc] = 0;
  qcoeff_scan[0xd] = 0;
  qcoeff_scan[0xe] = 0;
  qcoeff_scan[0xf] = 0;
  qcoeff_scan[8] = 0;
  qcoeff_scan[9] = 0;
  qcoeff_scan[10] = 0;
  qcoeff_scan[0xb] = 0;
  qcoeff_scan[0] = 0;
  qcoeff_scan[1] = 0;
  qcoeff_scan[2] = 0;
  qcoeff_scan[3] = 0;
  qcoeff_scan[6] = 0x2a;
  qcoeff_scan[7] = 0;
  qcoeff_scan[0x16] = 0;
  qcoeff_scan[0x17] = -0x1e;
  Dropout('\x06','\x06',(int)qcoeff_scan,in_ECX,in_R8);
  piVar2 = &DAT_00b655a0;
  piVar3 = local_90;
  for (lVar1 = 0x20; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  __l._M_len = 0x20;
  __l._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_130,__l,&local_131);
  ExpectArrayEq(qcoeff_scan,(vector<int,_std::allocator<int>_> *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_130);
  return;
}

Assistant:

TEST(DropoutTest, KeepsLargeCoeffs) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 6;
  // Large isolated coeffs should be preserved.
  tran_low_t qcoeff_scan[] = { 0, 0, 0, 0, 0, 0, 42, 0,    // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 42, 0,    //
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  //
                               0, 0, 0, 0, 0, 0, 0,  0 });
}